

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence::~IfcAnnotationFillAreaOccurrence
          (IfcAnnotationFillAreaOccurrence *this)

{
  void *pvVar1;
  
  *(undefined8 *)&this[-1].field_0x60 = 0x954500;
  *(undefined8 *)&this->field_0x48 = 0x9545a0;
  *(undefined8 *)&this[-1].field_0x70 = 0x954528;
  *(undefined8 *)&this[-1].field_0xd0 = 0x954550;
  *(undefined8 *)this = 0x954578;
  if (*(undefined1 **)&this->field_0x20 != &this->field_0x30) {
    operator_delete(*(undefined1 **)&this->field_0x20);
  }
  *(undefined8 *)&this[-1].field_0x60 = 0x954718;
  *(undefined8 *)&this->field_0x48 = 0x954768;
  *(undefined8 *)&this[-1].field_0x70 = 0x954740;
  if (*(undefined1 **)&this[-1].field_0xa8 != &this[-1].field_0xb8) {
    operator_delete(*(undefined1 **)&this[-1].field_0xa8);
  }
  pvVar1 = *(void **)&this[-1].
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence,_2UL>
                      .field_0x10;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1);
  }
  operator_delete(&this[-1].field_0x60);
  return;
}

Assistant:

IfcAnnotationFillAreaOccurrence() : Object("IfcAnnotationFillAreaOccurrence") {}